

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

ElementMatcherPairs * __thiscall
testing::internal::MaxBipartiteMatchState::Compute
          (ElementMatcherPairs *__return_storage_ptr__,MaxBipartiteMatchState *this)

{
  pointer *pppVar1;
  unsigned_long uVar2;
  iterator __position;
  ostream *poVar3;
  MatchMatrix *pMVar4;
  pointer puVar5;
  pointer puVar6;
  unsigned_long uVar7;
  size_t ilhs;
  vector<char,_std::allocator<char>_> seen;
  pair<unsigned_long,_unsigned_long> local_58;
  vector<char,_std::allocator<char>_> local_48;
  
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pMVar4 = this->graph_;
  if (*(ulong *)pMVar4 != 0) {
    ilhs = 0;
    do {
      if ((this->left_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[ilhs] != 0xffffffffffffffff) {
        GTestLog::GTestLog((GTestLog *)&local_58,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/thirdparty/gmock/gmock-gtest-all.cc"
                           ,0x27d3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition left_[ilhs] == kUnused failed. ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ilhs: ",6);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", left_[ilhs]: ",0xf);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        GTestLog::~GTestLog((GTestLog *)&local_58);
        pMVar4 = this->graph_;
      }
      local_58.first = local_58.first & 0xffffffffffffff00;
      std::vector<char,_std::allocator<char>_>::_M_fill_assign
                (&local_48,*(size_type *)(pMVar4 + 8),(value_type *)&local_58);
      TryAugment(this,ilhs,&local_48);
      ilhs = ilhs + 1;
      pMVar4 = this->graph_;
    } while (ilhs < *(ulong *)pMVar4);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar5 = (this->left_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->left_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar6 != puVar5) {
    uVar7 = 0;
    do {
      uVar2 = puVar5[uVar7];
      if (uVar2 != 0xffffffffffffffff) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_58.first = uVar7;
        local_58.second = uVar2;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)__return_storage_ptr__,__position,&local_58);
        }
        else {
          (__position._M_current)->first = uVar7;
          (__position._M_current)->second = uVar2;
          pppVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
        puVar5 = (this->left_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar6 = (this->left_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)puVar6 - (long)puVar5 >> 3));
  }
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ElementMatcherPairs Compute() {
    // 'seen' is used for path finding { 0: unseen, 1: seen }.
    ::std::vector<char> seen;
    // Searches the residual flow graph for a path from each left node to
    // the sink in the residual flow graph, and if one is found, add flow
    // to the graph. It's okay to search through the left nodes once. The
    // edge from the implicit source node to each previously-visited left
    // node will have flow if that left node has any path to the sink
    // whatsoever. Subsequent augmentations can only add flow to the
    // network, and cannot take away that previous flow unit from the source.
    // Since the source-to-left edge can only carry one flow unit (or,
    // each element can be matched to only one matcher), there is no need
    // to visit the left nodes more than once looking for augmented paths.
    // The flow is known to be possible or impossible by looking at the
    // node once.
    for (size_t ilhs = 0; ilhs < graph_->LhsSize(); ++ilhs) {
      // Reset the path-marking vector and try to find a path from
      // source to sink starting at the left_[ilhs] node.
      GTEST_CHECK_(left_[ilhs] == kUnused)
          << "ilhs: " << ilhs << ", left_[ilhs]: " << left_[ilhs];
      // 'seen' initialized to 'graph_->RhsSize()' copies of 0.
      seen.assign(graph_->RhsSize(), 0);
      TryAugment(ilhs, &seen);
    }
    ElementMatcherPairs result;
    for (size_t ilhs = 0; ilhs < left_.size(); ++ilhs) {
      size_t irhs = left_[ilhs];
      if (irhs == kUnused) continue;
      result.push_back(ElementMatcherPair(ilhs, irhs));
    }
    return result;
  }